

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O0

void TPZFrontNonSym<std::complex<float>_>::main(void)

{
  complex<float> cVar1;
  int iVar2;
  complex<float> *this;
  char *pcVar3;
  DecomposeType decType;
  TPZFMatrix<std::complex<float>_> Load_2;
  double rnd_1;
  int random_1;
  TPZFMatrix<std::complex<float>_> Load;
  ofstream outeqn;
  TPZEqnArray<std::complex<float>_> Result;
  ofstream output;
  string OutFile;
  TPZVec<long> DestIndex;
  TPZFrontNonSym<std::complex<float>_> TestFront;
  TPZFMatrix<std::complex<float>_> Prova;
  double rnd;
  int random;
  TPZFMatrix<std::complex<float>_> TestMatrix;
  int matsize;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffc528;
  DecomposeType in_stack_ffffffffffffc52c;
  undefined4 in_stack_ffffffffffffc530;
  float in_stack_ffffffffffffc534;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffc538;
  TPZFrontNonSym<std::complex<float>_> *in_stack_ffffffffffffc540;
  string *this_00;
  TPZVec<long> *in_stack_ffffffffffffc548;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffc550;
  complex<float> *in_stack_ffffffffffffc558;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffc560;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffc568;
  undefined4 in_stack_ffffffffffffc570;
  float in_stack_ffffffffffffc574;
  undefined4 in_stack_ffffffffffffc580;
  undefined4 in_stack_ffffffffffffc584;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffc588;
  int64_t in_stack_ffffffffffffc590;
  int64_t in_stack_ffffffffffffc598;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffc5a0;
  DecomposeType in_stack_ffffffffffffc5b4;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffc5b8;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffc5c0;
  DecomposeType in_stack_ffffffffffffc5d4;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffc5d8;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffc5e0;
  TPZFrontNonSym<std::complex<float>_> *in_stack_ffffffffffffc6a0;
  undefined1 local_3948 [788];
  MatrixOutputFormat in_stack_ffffffffffffc9cc;
  ostream *in_stack_ffffffffffffc9d0;
  char *in_stack_ffffffffffffc9d8;
  TPZMatrix<std::complex<float>_> *in_stack_ffffffffffffc9e0;
  undefined1 local_4b8 [512];
  string local_2b8 [32];
  TPZVec<long> local_298 [15];
  double local_b0;
  int local_a4;
  int local_c;
  int local_8;
  int local_4;
  
  local_c = 6;
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_ffffffffffffc5a0,in_stack_ffffffffffffc598,in_stack_ffffffffffffc590);
  for (local_4 = 0; local_4 < local_c; local_4 = local_4 + 1) {
    for (local_8 = local_4; local_8 < local_c; local_8 = local_8 + 1) {
      local_a4 = rand();
      iVar2 = (local_a4 * local_c) / 0x7fff;
      local_b0 = (double)iVar2;
      in_stack_ffffffffffffc574 = (float)iVar2;
      this = TPZFMatrix<std::complex<float>_>::operator()
                       (in_stack_ffffffffffffc550,(int64_t)in_stack_ffffffffffffc548,
                        (int64_t)in_stack_ffffffffffffc540);
      std::complex<float>::operator=(this,in_stack_ffffffffffffc574);
      in_stack_ffffffffffffc568 =
           (TPZFMatrix<std::complex<float>_> *)
           TPZFMatrix<std::complex<float>_>::operator()
                     (in_stack_ffffffffffffc550,(int64_t)in_stack_ffffffffffffc548,
                      (int64_t)in_stack_ffffffffffffc540);
      in_stack_ffffffffffffc560 =
           (TPZEqnArray<std::complex<float>_> *)
           TPZFMatrix<std::complex<float>_>::operator()
                     (in_stack_ffffffffffffc550,(int64_t)in_stack_ffffffffffffc548,
                      (int64_t)in_stack_ffffffffffffc540);
      cVar1._M_value =
           (_ComplexT)
           (in_stack_ffffffffffffc568->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
           super_TPZSavable._vptr_TPZSavable;
      in_stack_ffffffffffffc560->fSymmetric = (int)cVar1._M_value;
      in_stack_ffffffffffffc560->fNumEq = (int)(cVar1._M_value >> 0x20);
      if (local_4 == local_8) {
        in_stack_ffffffffffffc558 =
             TPZFMatrix<std::complex<float>_>::operator()
                       (in_stack_ffffffffffffc550,(int64_t)in_stack_ffffffffffffc548,
                        (int64_t)in_stack_ffffffffffffc540);
        std::complex<float>::operator=(in_stack_ffffffffffffc558,6000.0);
      }
    }
  }
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            ((TPZFMatrix<std::complex<float>_> *)in_stack_ffffffffffffc560);
  TPZFMatrix<std::complex<float>_>::operator=
            (in_stack_ffffffffffffc588,
             (TPZFMatrix<std::complex<float>_> *)
             CONCAT44(in_stack_ffffffffffffc584,in_stack_ffffffffffffc580));
  TPZMatrix<std::complex<float>_>::Print
            (in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0,
             in_stack_ffffffffffffc9cc);
  TPZFrontNonSym(in_stack_ffffffffffffc540,(int64_t)in_stack_ffffffffffffc538);
  TPZVec<long>::TPZVec
            ((TPZVec<long> *)CONCAT44(in_stack_ffffffffffffc534,in_stack_ffffffffffffc530),
             CONCAT44(in_stack_ffffffffffffc52c,in_stack_ffffffffffffc528));
  for (local_4 = 0; local_4 < local_c; local_4 = local_4 + 1) {
    in_stack_ffffffffffffc548 = (TPZVec<long> *)(long)local_4;
    in_stack_ffffffffffffc550 =
         (TPZFMatrix<std::complex<float>_> *)
         TPZVec<long>::operator[](local_298,(int64_t)in_stack_ffffffffffffc548);
    (in_stack_ffffffffffffc550->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)in_stack_ffffffffffffc548;
  }
  SymbolicAddKel((TPZFrontNonSym<std::complex<float>_> *)in_stack_ffffffffffffc550,
                 in_stack_ffffffffffffc548);
  SymbolicDecomposeEquations
            (in_stack_ffffffffffffc540,(int64_t)in_stack_ffffffffffffc538,
             CONCAT44(in_stack_ffffffffffffc534,in_stack_ffffffffffffc530));
  this_00 = local_2b8;
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::operator=(this_00,"TPZFrontNonSymTest.txt");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_4b8,pcVar3,_S_app);
  Compress(in_stack_ffffffffffffc6a0);
  AllocData((TPZFrontNonSym<std::complex<float>_> *)this_00);
  AddKel((TPZFrontNonSym<std::complex<float>_> *)
         CONCAT44(in_stack_ffffffffffffc574,in_stack_ffffffffffffc570),in_stack_ffffffffffffc568,
         (TPZVec<long> *)in_stack_ffffffffffffc560);
  TPZEqnArray<std::complex<float>_>::TPZEqnArray(in_stack_ffffffffffffc560);
  DecomposeEquations((TPZFrontNonSym<std::complex<float>_> *)in_stack_ffffffffffffc550,
                     (int64_t)in_stack_ffffffffffffc548,(int64_t)this_00,in_stack_ffffffffffffc538);
  std::ofstream::ofstream(local_3948,"TestEQNArray.txt",_S_app);
  TPZEqnArray<std::complex<float>_>::Print
            (in_stack_ffffffffffffc560,(char *)in_stack_ffffffffffffc558,
             (ostream *)in_stack_ffffffffffffc550);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_ffffffffffffc5a0,in_stack_ffffffffffffc598,in_stack_ffffffffffffc590);
  for (local_4 = 0; local_4 < local_c; local_4 = local_4 + 1) {
    iVar2 = rand();
    in_stack_ffffffffffffc534 = (float)((iVar2 * local_c) / 0x7fff);
    in_stack_ffffffffffffc538 =
         (TPZEqnArray<std::complex<float>_> *)
         TPZFMatrix<std::complex<float>_>::operator()
                   (in_stack_ffffffffffffc550,(int64_t)in_stack_ffffffffffffc548,(int64_t)this_00);
    std::complex<float>::operator=
              ((complex<float> *)in_stack_ffffffffffffc538,in_stack_ffffffffffffc534);
  }
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_ffffffffffffc5a0,in_stack_ffffffffffffc598,in_stack_ffffffffffffc590);
  TPZFMatrix<std::complex<float>_>::operator=
            (in_stack_ffffffffffffc588,
             (TPZFMatrix<std::complex<float>_> *)
             CONCAT44(in_stack_ffffffffffffc584,in_stack_ffffffffffffc580));
  TPZMatrix<std::complex<float>_>::SolveDirect
            ((TPZMatrix<std::complex<float>_> *)in_stack_ffffffffffffc538,
             (TPZFMatrix<std::complex<float>_> *)
             CONCAT44(in_stack_ffffffffffffc534,in_stack_ffffffffffffc530),in_stack_ffffffffffffc52c
            );
  TPZMatrix<std::complex<float>_>::Print
            (in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0,
             in_stack_ffffffffffffc9cc);
  TPZEqnArray<std::complex<float>_>::EqnForward
            (in_stack_ffffffffffffc5e0,in_stack_ffffffffffffc5d8,in_stack_ffffffffffffc5d4);
  TPZEqnArray<std::complex<float>_>::EqnBackward
            (in_stack_ffffffffffffc5c0,in_stack_ffffffffffffc5b8,in_stack_ffffffffffffc5b4);
  TPZMatrix<std::complex<float>_>::Print
            (in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0,
             in_stack_ffffffffffffc9cc);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1d1e2ff);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1d1e30c);
  std::ofstream::~ofstream(local_3948);
  TPZEqnArray<std::complex<float>_>::~TPZEqnArray
            ((TPZEqnArray<std::complex<float>_> *)
             CONCAT44(in_stack_ffffffffffffc534,in_stack_ffffffffffffc530));
  std::ofstream::~ofstream(local_4b8);
  std::__cxx11::string::~string(local_2b8);
  TPZVec<long>::~TPZVec
            ((TPZVec<long> *)CONCAT44(in_stack_ffffffffffffc534,in_stack_ffffffffffffc530));
  ~TPZFrontNonSym((TPZFrontNonSym<std::complex<float>_> *)0x1d1e35a);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1d1e367);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1d1e374);
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::main()
{
	int i, j;
	/**
	 * 	Populates data structure
	 */
	int matsize=6;
	TPZFMatrix<TVar> TestMatrix(matsize,matsize);
	for(i=0;i<matsize;i++) {
		for(j=i;j<matsize;j++) {
			int random = rand();
			double rnd = (random*matsize)/0x7fff;
			TestMatrix(i,j)=rnd;
			TestMatrix(j,i)=TestMatrix(i,j);
			if(i==j) TestMatrix(i,j)=6000.;
		}
	}
	
	TPZFMatrix<TVar> Prova;
	Prova=TestMatrix;
	
	//	Prova.Decompose_Cholesky();
	Prova.Print("TPZFMatrix<TVar> Cholesky");
	
	TPZFrontNonSym TestFront(matsize);
	
	
	TPZVec<int64_t> DestIndex(matsize);
	for(i=0;i<matsize;i++) DestIndex[i]=i;
	
	TestFront.SymbolicAddKel(DestIndex);
	TestFront.SymbolicDecomposeEquations(0,matsize-1); 
	
	std::string OutFile;
	OutFile = "TPZFrontNonSymTest.txt";
	
	ofstream output(OutFile.c_str(),ios::app);
	
	TestFront.Compress();
	
	TestFront.AllocData();
	
	TestFront.AddKel(TestMatrix, DestIndex);
	TPZEqnArray<TVar> Result;

	TestFront.DecomposeEquations(0,matsize-1,Result);
	ofstream outeqn("TestEQNArray.txt",ios::app);
	
	Result.Print("TestEQNArray.txt",outeqn);
	
	
	TPZFMatrix<TVar> Load(matsize);
	
	for(i=0;i<matsize;i++) {
		int random = rand();
		double rnd = (random*matsize)/0x7fff;
		Load(i,0)=rnd;
	}
	
	TPZFMatrix<TVar> Load_2(matsize);
	Load_2=Load;
	
	DecomposeType decType = ECholesky;
	Prova.SolveDirect(Load, decType);
	
	Load.Print("Load");
	//TestFront.Print(OutFile, output);
	
	Result.EqnForward(Load_2, decType);
	Result.EqnBackward(Load_2, decType);
	
	Load_2.Print("Eqn");
}